

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

double __thiscall HDual::an_bs_cond(HDual *this,HModel *ptr_model)

{
  HVector *this_00;
  double dVar1;
  uint uVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  int iVar10;
  ulong uVar11;
  int r_n_2;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  double extraout_XMM0_Qa;
  double dVar16;
  double dVar17;
  double dVar18;
  
  this->model = ptr_model;
  this->matrix = &ptr_model->matrix;
  piVar3 = (ptr_model->matrix).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (ptr_model->matrix).Avalue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_x,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_y,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_z,(long)this->numRow);
  std::vector<double,_std::allocator<double>_>::resize(&this->bs_cond_w,(long)this->numRow);
  uVar2 = this->numRow;
  pdVar5 = (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = uVar12;
  }
  for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
    pdVar5[uVar12] = 1.0 / (double)(int)uVar2;
  }
  this_00 = &this->row_ep;
  HVector::clear(this_00);
  iVar10 = this->numRow;
  (this->row_ep).count = iVar10;
  piVar6 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar16 = extraout_XMM0_Qa;
  for (lVar14 = 0; lVar14 < iVar10; lVar14 = lVar14 + 1) {
    piVar6[lVar14] = (int)lVar14;
    dVar16 = pdVar5[lVar14];
    pdVar7[lVar14] = dVar16;
    iVar10 = this->numRow;
  }
  for (iVar10 = 1; iVar10 != 6; iVar10 = iVar10 + 1) {
    (this->row_ep).packFlag = false;
    HFactor::ftran(this->factor,this_00,1.0);
    pdVar5 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->bs_cond_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->bs_cond_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (ulong)(uint)this->numRow;
    if (this->numRow < 1) {
      uVar11 = 0;
    }
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      dVar16 = pdVar5[uVar12];
      pdVar7[uVar12] = dVar16;
      if (dVar16 <= 0.0) {
        if (0.0 <= dVar16) {
          pdVar8[uVar12] = 0.0;
        }
        else {
          pdVar8[uVar12] = -1.0;
        }
      }
      else {
        pdVar8[uVar12] = 1.0;
      }
    }
    HVector::clear(this_00);
    iVar13 = this->numRow;
    (this->row_ep).count = iVar13;
    piVar6 = (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->bs_cond_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar14 = 0; lVar14 < iVar13; lVar14 = lVar14 + 1) {
      piVar6[lVar14] = (int)lVar14;
      pdVar7[lVar14] = pdVar5[lVar14];
      iVar13 = this->numRow;
    }
    (this->row_ep).packFlag = false;
    HFactor::btran(this->factor,this_00,1.0);
    pdVar5 = (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->bs_cond_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->bs_cond_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = (ulong)(uint)this->numRow;
    if (this->numRow < 1) {
      uVar11 = 0;
    }
    dVar17 = 0.0;
    dVar18 = 0.0;
    uVar12 = 0xffffffffffffffff;
    dVar16 = 0.0;
    for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
      dVar1 = pdVar5[uVar15];
      pdVar7[uVar15] = dVar1;
      if (dVar17 < ABS(dVar1)) {
        uVar12 = uVar15;
        dVar17 = ABS(dVar1);
      }
      uVar12 = uVar12 & 0xffffffff;
      dVar18 = dVar18 + dVar1 * pdVar8[uVar15];
      dVar16 = dVar16 + ABS(pdVar9[uVar15]);
    }
    if (dVar17 <= dVar18) break;
    pdVar5 = (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
      pdVar5[uVar15] = 0.0;
    }
    HVector::clear(this_00);
    (this->row_ep).count = 1;
    iVar13 = (int)uVar12;
    *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = iVar13;
    (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar13] = 1.0;
    (this->bs_cond_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar13] = 1.0;
  }
  uVar12 = 0;
  uVar11 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar11 = uVar12;
  }
  dVar17 = 0.0;
  for (; uVar12 != uVar11; uVar12 = uVar12 + 1) {
    iVar10 = (this->model->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar12];
    dVar18 = 1.0;
    if (iVar10 < this->numCol) {
      dVar18 = 0.0;
      for (lVar14 = (long)piVar3[iVar10]; lVar14 < piVar3[(long)iVar10 + 1]; lVar14 = lVar14 + 1) {
        dVar18 = dVar18 + ABS(pdVar4[lVar14]);
      }
    }
    if (dVar17 <= dVar18) {
      dVar17 = dVar18;
    }
  }
  return dVar16 * dVar17;
}

Assistant:

double HDual::an_bs_cond(HModel *ptr_model) {
  model = ptr_model;
  // Alias to the matrix
  matrix = model->getMatrix();
  const int *Astart = matrix->getAstart();
  const double *Avalue = matrix->getAvalue();
  //Compute the Hager condition number estimate for the basis matrix
  double NoDensity = 1;
  bs_cond_x.resize(numRow);
  bs_cond_y.resize(numRow);
  bs_cond_z.resize(numRow);
  bs_cond_w.resize(numRow);
  //x = ones(n,1)/n;
  //y = A\x;
  double mu = 1.0/numRow;
  double norm_Binv;
  for (int r_n=0; r_n < numRow; r_n++) bs_cond_x[r_n] = mu;
  row_ep.clear();
  row_ep.count = numRow;
  for (int r_n=0; r_n < numRow; r_n++) {
    row_ep.index[r_n] = r_n;
    row_ep.array[r_n] = bs_cond_x[r_n];
  }
  for (int ps_n=1; ps_n <= 5; ps_n++) {
    row_ep.packFlag = false;
    factor->ftran(row_ep, NoDensity);
  //zeta = sign(y);
    for (int r_n=0; r_n < numRow; r_n++) {
      bs_cond_y[r_n] = row_ep.array[r_n];
      if (bs_cond_y[r_n] > 0)
	bs_cond_w[r_n] =  1.0;
      else if (bs_cond_y[r_n] < 0)
	bs_cond_w[r_n] = -1.0;
      else	  
        bs_cond_w[r_n] =  0.0;
    }
  //z=A'\zeta;
    row_ep.clear();
    row_ep.count = numRow;
    for (int r_n=0; r_n < numRow; r_n++) {
      row_ep.index[r_n] = r_n;
      row_ep.array[r_n] = bs_cond_w[r_n];
    }
    row_ep.packFlag = false;
    factor->btran(row_ep, NoDensity);
  //norm_z = norm(z,'inf');
  //ztx = z'*x ;
  //NormEst = norm(y,1);
  //fd_i = 0;
  //for i=1:n
  //    if abs(z(i)) == norm_z
  //        fd_i = i;
  //        break
  //    end
  //end
    double norm_z = 0.0;
    double ztx = 0.0;
    norm_Binv = 0.0;
    int argmax_z = -1;
    for (int r_n=0; r_n < numRow; r_n++) {
      bs_cond_z[r_n] = row_ep.array[r_n];
      double abs_z_v = abs(bs_cond_z[r_n]);
	if (abs_z_v > norm_z) {
	  norm_z = abs_z_v;
	  argmax_z = r_n;
	}
      ztx += bs_cond_z[r_n]*bs_cond_x[r_n];
      norm_Binv += abs(bs_cond_y[r_n]);
    }
    //printf("%2d: ||z||_inf = %8.2g; z^T*x = %8.2g; ||y||_1 = %g\n", ps_n, norm_z, ztx, norm_Binv);
    if (norm_z <= ztx) break;
  //x = zeros(n,1);
  //x(fd_i) = 1;
    for (int r_n=0; r_n < numRow; r_n++) bs_cond_x[r_n] = 0.0;
    row_ep.clear();
    row_ep.count = 1;
    row_ep.index[0] = argmax_z;
    row_ep.array[argmax_z] = 1.0;
    bs_cond_x[argmax_z] = 1.0;
  }
  double norm_B = 0.0;
  for (int r_n=0; r_n < numRow; r_n++) {
    int vr_n = model->getBaseIndex()[r_n];
    double c_norm = 0.0;
    if (vr_n < numCol) 
      for (int el_n=Astart[vr_n]; el_n < Astart[vr_n+1]; el_n++) c_norm += abs(Avalue[el_n]);
    else 
      c_norm += 1.0;
    norm_B = max(c_norm, norm_B);
  }
  double cond_B = norm_Binv * norm_B;
 // printf("Hager estimate of ||B^{-1}||_1 = %g; ||B||_1 = %g so cond_1(B) estimate is %g\n", norm_Binv, norm_B, cond_B);
  return cond_B;
}